

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall QDataWidgetMapper::removeMapping(QDataWidgetMapper *this,QWidget *widget)

{
  long lVar1;
  int iVar2;
  QDataWidgetMapperPrivate *this_00;
  QObject *in_RSI;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  int idx;
  QDataWidgetMapperPrivate *d;
  __normal_iterator<QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
  *in_stack_ffffffffffffffa8;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  *this_01;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  *in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QDataWidgetMapper *)0x870f6a);
  iVar2 = QDataWidgetMapperPrivate::findWidget(this_00,in_stack_ffffffffffffffe8);
  if (iVar2 != -1) {
    this_01 = &this_00->widgetMap;
    std::
    vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
    ::begin(this_01);
    __gnu_cxx::
    __normal_iterator<QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
    ::operator+((__normal_iterator<QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
                 *)in_stack_ffffffffffffffb8,(difference_type)this_01);
    __gnu_cxx::
    __normal_iterator<QDataWidgetMapperPrivate::WidgetMapper_const*,std::vector<QDataWidgetMapperPrivate::WidgetMapper,std::allocator<QDataWidgetMapperPrivate::WidgetMapper>>>
    ::__normal_iterator<QDataWidgetMapperPrivate::WidgetMapper*>
              ((__normal_iterator<const_QDataWidgetMapperPrivate::WidgetMapper_*,_std::vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>_>
                *)this_01,in_stack_ffffffffffffffa8);
    std::
    vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
    ::erase(in_stack_ffffffffffffffb8,in_RDI);
    QObject::removeEventFilter(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDataWidgetMapper::removeMapping(QWidget *widget)
{
    Q_D(QDataWidgetMapper);

    int idx = d->findWidget(widget);
    if (idx == -1)
        return;

    d->widgetMap.erase(d->widgetMap.begin() + idx);
    widget->removeEventFilter(d->delegate);
}